

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageSync(Fts5Storage *p)

{
  sqlite3_int64 iRowid;
  i64 iLastRowid;
  int rc;
  Fts5Storage *p_local;
  
  iLastRowid._4_4_ = 0;
  iRowid = sqlite3_last_insert_rowid(p->pConfig->db);
  if (p->bTotalsValid != 0) {
    iLastRowid._4_4_ = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
  }
  if (iLastRowid._4_4_ == 0) {
    iLastRowid._4_4_ = sqlite3Fts5IndexSync(p->pIndex);
  }
  sqlite3_set_last_insert_rowid(p->pConfig->db,iRowid);
  return iLastRowid._4_4_;
}

Assistant:

static int sqlite3Fts5StorageSync(Fts5Storage *p){
  int rc = SQLITE_OK;
  i64 iLastRowid = sqlite3_last_insert_rowid(p->pConfig->db);
  if( p->bTotalsValid ){
    rc = fts5StorageSaveTotals(p);
    p->bTotalsValid = 0;
  }
  if( rc==SQLITE_OK ){
    rc = sqlite3Fts5IndexSync(p->pIndex);
  }
  sqlite3_set_last_insert_rowid(p->pConfig->db, iLastRowid);
  return rc;
}